

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * fts3QuoteId(char *zInput)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  
  sVar1 = strlen(zInput);
  pcVar2 = (char *)sqlite3_malloc64((long)((int)sVar1 * 2 + 3));
  if (pcVar2 == (char *)0x0) {
    return (char *)0x0;
  }
  *pcVar2 = '\"';
  pcVar3 = pcVar2;
  do {
    cVar4 = *zInput;
    if (cVar4 == '\"') {
      pcVar3[1] = '\"';
      pcVar3 = pcVar3 + 2;
      cVar4 = *zInput;
    }
    else {
      if (cVar4 == '\0') {
        pcVar3[1] = '\"';
        pcVar3[2] = '\0';
        return pcVar2;
      }
      pcVar3 = pcVar3 + 1;
    }
    *pcVar3 = cVar4;
    zInput = zInput + 1;
  } while( true );
}

Assistant:

static char *fts3QuoteId(char const *zInput){
  sqlite3_int64 nRet;
  char *zRet;
  nRet = 2 + (int)strlen(zInput)*2 + 1;
  zRet = sqlite3_malloc64(nRet);
  if( zRet ){
    int i;
    char *z = zRet;
    *(z++) = '"';
    for(i=0; zInput[i]; i++){
      if( zInput[i]=='"' ) *(z++) = '"';
      *(z++) = zInput[i];
    }
    *(z++) = '"';
    *(z++) = '\0';
  }
  return zRet;
}